

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugLocationPropagation.cpp
# Opt level: O1

void wasm::DebugLocationPropagation::doPreVisit(DebugLocationPropagation *self,Expression **currp)

{
  Function *pFVar1;
  ulong uVar2;
  Function *pFVar3;
  undefined8 uVar4;
  _Hash_node_base *p_Var5;
  Expression *pEVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  _Hash_node_base *p_Var11;
  Expression *local_28;
  Expression *curr;
  
  local_28 = *currp;
  pFVar1 = (self->
           super_WalkerPass<wasm::PostWalker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>_>
           ).
           super_PostWalker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
           .
           super_Walker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
           .currFunction;
  uVar2 = (pFVar1->debugLocations)._M_h._M_bucket_count;
  uVar8 = (ulong)local_28 % uVar2;
  p_Var9 = (pFVar1->debugLocations)._M_h._M_buckets[uVar8];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var11 = p_Var9->_M_nxt, p_Var10 = p_Var9, local_28 != (Expression *)p_Var9->_M_nxt[1]._M_nxt
     )) {
    while (p_Var9 = p_Var11, p_Var11 = p_Var9->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)p_Var11[1]._M_nxt % uVar2 != uVar8) ||
         (p_Var10 = p_Var9, local_28 == (Expression *)p_Var11[1]._M_nxt)) goto LAB_0085094f;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_0085094f:
  if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
    pEVar6 = getPrevious(self);
    if (pEVar6 == (Expression *)0x0) {
      pFVar3 = (self->
               super_WalkerPass<wasm::PostWalker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>_>
               ).
               super_PostWalker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
               .
               super_Walker<wasm::DebugLocationPropagation,_wasm::Visitor<wasm::DebugLocationPropagation,_void>_>
               .currFunction;
      if ((pFVar3->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true)
      {
        pmVar7 = std::__detail::
                 _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&pFVar1->debugLocations,&local_28);
        uVar4 = *(undefined8 *)
                 ((long)&(pFVar3->prologLocation).
                         super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8)
        ;
        *(undefined8 *)
         &(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
             *(undefined8 *)
              &(pFVar3->prologLocation).
               super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
        *(undefined8 *)
         ((long)&(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload +
         8) = uVar4;
        *(undefined4 *)
         ((long)&(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                 _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload
         + 4) = *(undefined4 *)
                 ((long)&(pFVar3->prologLocation).
                         super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                         _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4
                 );
        if ((pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
            super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == false) {
          (pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = true;
        }
      }
    }
    else {
      uVar2 = (pFVar1->debugLocations)._M_h._M_bucket_count;
      uVar8 = (ulong)pEVar6 % uVar2;
      p_Var9 = (pFVar1->debugLocations)._M_h._M_buckets[uVar8];
      p_Var10 = (__node_base_ptr)0x0;
      if ((p_Var9 != (__node_base_ptr)0x0) &&
         (p_Var11 = p_Var9->_M_nxt, p_Var10 = p_Var9,
         pEVar6 != (Expression *)p_Var9->_M_nxt[1]._M_nxt)) {
        while (p_Var9 = p_Var11, p_Var11 = p_Var9->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
          p_Var10 = (__node_base_ptr)0x0;
          if (((ulong)p_Var11[1]._M_nxt % uVar2 != uVar8) ||
             (p_Var10 = p_Var9, pEVar6 == (Expression *)p_Var11[1]._M_nxt)) goto LAB_00850a10;
        }
        p_Var10 = (__node_base_ptr)0x0;
      }
LAB_00850a10:
      if (p_Var10 == (__node_base_ptr)0x0) {
        p_Var11 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var11 = p_Var10->_M_nxt;
      }
      if (p_Var11 != (_Hash_node_base *)0x0) {
        pmVar7 = std::__detail::
                 _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&pFVar1->debugLocations,&local_28);
        p_Var5 = p_Var11[3]._M_nxt;
        *(_Hash_node_base **)
         &(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload = p_Var11[2]._M_nxt
        ;
        *(_Hash_node_base **)
         ((long)&(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload +
         8) = p_Var5;
        *(_Hash_node_base **)
         ((long)&(pmVar7->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                 _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                 _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload
         + 4) = p_Var11[4]._M_nxt;
      }
    }
  }
  SmallVector<wasm::Expression_*,_10UL>::push_back(&self->expressionStack,&local_28);
  return;
}

Assistant:

static void doPreVisit(DebugLocationPropagation* self, Expression** currp) {
    auto* curr = *currp;
    auto& locs = self->getFunction()->debugLocations;
    auto& expressionStack = self->expressionStack;
    if (locs.find(curr) == locs.end()) {
      // No debug location, see if we should inherit one.
      if (auto* previous = self->getPrevious()) {
        if (auto it = locs.find(previous); it != locs.end()) {
          locs[curr] = it->second;
        }
      } else if (self->getFunction()->prologLocation) {
        // Instructions may inherit their locations from the function
        // prolog.
        locs[curr] = *self->getFunction()->prologLocation;
      }
    }
    expressionStack.push_back(curr);
  }